

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

bool __thiscall
VertexClustering::localEnergyRelease
          (VertexClustering *this,VCCluster *c1,VCCluster *c2,VCEdge *e,
          queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *q2,bool constrain)

{
  bool bVar1;
  bool bVar2;
  VCFace *f;
  VCCluster *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (c1->isNull == false) {
    if (c2->isNull == false) {
      (*c1->_vptr_VCCluster[4])(c1);
      (*c2->_vptr_VCCluster[4])(c2);
      (*c1->_vptr_VCCluster[5])(c1,e->f2);
      (*c2->_vptr_VCCluster[6])(c2,e->f2);
      dVar3 = extraout_XMM0_Qa_02 + extraout_XMM0_Qa_01;
      (*c1->_vptr_VCCluster[6])(c1,e->f1);
      this_00 = c2;
      (*c2->_vptr_VCCluster[5])(c2,e->f1);
      dVar4 = extraout_XMM0_Qa_04 + extraout_XMM0_Qa_03;
      if (constrain) {
        bVar1 = transferLeadsToDisconnect((VertexClustering *)this_00,c1,e->f1);
        bVar2 = transferLeadsToDisconnect((VertexClustering *)this_00,c2,e->f2);
        if (!bVar2) {
          dVar3 = 1.79769313486232e+308;
        }
        if (!bVar1) {
          dVar4 = 1.79769313486232e+308;
        }
      }
      dVar5 = dVar3;
      if (extraout_XMM0_Qa_00 + extraout_XMM0_Qa <= dVar3) {
        dVar5 = extraout_XMM0_Qa_00 + extraout_XMM0_Qa;
      }
      dVar6 = dVar4;
      if (dVar5 <= dVar4) {
        dVar6 = dVar5;
      }
      if ((dVar6 != dVar3) || (NAN(dVar6) || NAN(dVar3))) {
        if ((dVar6 != dVar4) || (NAN(dVar6) || NAN(dVar4))) {
          std::deque<VCEdge,_std::allocator<VCEdge>_>::push_back(&q2->c,e);
          return false;
        }
        goto LAB_00149fd1;
      }
    }
    VCCluster::giveItem(c2,e->f2,c1);
    f = e->f2;
  }
  else {
LAB_00149fd1:
    VCCluster::giveItem(c1,e->f1,c2);
    f = e->f1;
  }
  pushNeighbors(this,f,e,q2);
  return true;
}

Assistant:

bool VertexClustering::localEnergyRelease(VCCluster* c1, VCCluster* c2, VCEdge& e, queue<VCEdge> *q2, bool constrain) {
	double L0, L1, L2;
	if (c1->isNull) goto localEnergyRelease_c1_c2;
	if (c2->isNull) goto localEnergyRelease_c2_c1;
	L0 = c1->energy() + c2->energy();
	L1 = c1->energyWithItem(e.f2) + c2->energyWithoutItem(e.f2);
	L2 = c1->energyWithoutItem(e.f1) + c2->energyWithItem(e.f1);
	double minEnergy;
	if (constrain) {
		bool c1_ok = transferLeadsToDisconnect(c1, e.f1);
		bool c2_ok = transferLeadsToDisconnect(c2, e.f2);
		if (!c2_ok) 
			L1 = numeric_limits<double>::max();
		if (!c1_ok) 
			L2 = numeric_limits<double>::max();
	}
	minEnergy = min(min(L0, L1), L2);
	if (minEnergy == L1) 
		goto localEnergyRelease_c2_c1;
	else if (minEnergy == L2) 
		goto localEnergyRelease_c1_c2;
	q2->push(e);
	return false;

localEnergyRelease_c2_c1:
	c2->giveItem(e.f2, c1);
	pushNeighbors(e.f2, e, q2);
	return true;
localEnergyRelease_c1_c2:
	c1->giveItem(e.f1, c2);
	pushNeighbors(e.f1, e, q2);
	return true;
}